

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_get_proc_grid(Integer g_a,Integer *dims)

{
  long lVar1;
  ushort uVar2;
  global_array_t *pgVar3;
  ulong uVar4;
  char err_string [256];
  char acStack_128 [256];
  
  lVar1 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar1)) {
    sprintf(acStack_128,"%s: INVALID ARRAY HANDLE","ga_get_proc_grid");
    pnga_error(acStack_128,g_a);
  }
  if (GA[lVar1].actv == 0) {
    sprintf(acStack_128,"%s: ARRAY NOT ACTIVE","ga_get_proc_grid");
    pnga_error(acStack_128,g_a);
  }
  pgVar3 = GA;
  uVar2 = GA[lVar1].ndim;
  uVar4 = 0;
  if ((short)uVar2 < 1) {
    uVar2 = 0;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    dims[uVar4] = (long)pgVar3[g_a + 1000].nblock[uVar4];
  }
  return;
}

Assistant:

void pnga_get_proc_grid(Integer g_a, Integer *dims)
{
  Integer i, ndim, ga_handle = GA_OFFSET + g_a;
  ga_check_handleM(g_a, "ga_get_proc_grid");
  ndim = GA[ga_handle].ndim;
  for (i=0; i<ndim; i++) {
    dims[i] = GA[ga_handle].nblock[i];
  }
}